

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O0

int Timidity::load_connection(ULONG cConnections,CONNECTION *artList,USHORT destination)

{
  CONNECTION *pCVar1;
  CONNECTION *conn;
  uint local_20;
  int value;
  ULONG i;
  USHORT destination_local;
  CONNECTION *artList_local;
  ULONG cConnections_local;
  
  conn._4_4_ = 0;
  for (local_20 = 0; local_20 < cConnections; local_20 = local_20 + 1) {
    pCVar1 = artList + local_20;
    if ((((pCVar1->usDestination == destination) && (pCVar1->usSource == 0)) &&
        (pCVar1->usControl == 0)) && (pCVar1->usTransform == 0)) {
      conn._4_4_ = pCVar1->lScale + conn._4_4_;
    }
  }
  return conn._4_4_;
}

Assistant:

static int load_connection(ULONG cConnections, CONNECTION *artList, USHORT destination)
{
	ULONG i;
	int value = 0;
	for (i = 0; i < cConnections; ++i) {
		CONNECTION *conn = &artList[i];
		if(conn->usDestination == destination) {
			// The formula for the destination is:
			// usDestination = usDestination + usTransform(usSource * (usControl * lScale))
			// Since we are only handling source/control of NONE and identity
			// transform, this simplifies to: usDestination = usDestination + lScale
			if (conn->usSource == CONN_SRC_NONE &&
				conn->usControl == CONN_SRC_NONE &&
				conn->usTransform == CONN_TRN_NONE)
				value += conn->lScale;
		}
	}
	return value;
}